

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,MapOrSetDataNode<void_*> **value)

{
  BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  void *pvVar2;
  MapOrSetDataNode<void_*> *pMVar3;
  long lVar4;
  code *pcVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 *puVar9;
  int hashCode;
  void *in_RCX;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint hashCode_00;
  DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  *this_00;
  WriteBarrierPtr<void> local_60;
  WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_> local_58;
  long local_50;
  long local_48;
  ulong local_40;
  uint local_34;
  
  lVar13 = *(long *)this;
  if (lVar13 == 0) {
    BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar13 = *(long *)this;
  }
  hashCode_00 = (uint)((ulong)*key >> 3) | 1;
  local_34 = BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode_00,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar12 = *(uint *)(lVar13 + (ulong)local_34 * 4);
  if ((int)uVar12 < 0) {
    cVar6 = (char)(uVar12 >> 0x18);
    uVar11 = 0;
  }
  else {
    in_RCX = *key;
    uVar11 = 0;
    do {
      if (*(void **)(*(long *)(this + 8) + 0x10 + (ulong)uVar12 * 0x18) == in_RCX) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar7) {
          *puVar9 = 0;
          return -1;
        }
        goto LAB_00d1e2c1;
      }
      uVar11 = uVar11 + 1;
      uVar12 = *(uint *)(*(long *)(this + 8) + (ulong)uVar12 * 0x18 + 8);
    } while (-1 < (int)uVar12);
    cVar6 = (char)(uVar12 >> 0x18);
  }
  hashCode = (int)in_RCX;
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar11);
  }
  iVar8 = -1;
  if (cVar6 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      uVar12 = *(uint *)(this + 0x20);
      if (uVar12 == *(uint *)(this + 0x18)) {
        BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this);
        local_34 = BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::GetBucket(hashCode_00,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        uVar12 = *(uint *)(this + 0x20);
      }
      uVar10 = (ulong)uVar12;
      *(uint *)(this + 0x20) = uVar12 + 1;
      if (*(int *)(this + 0x18) < (int)(uVar12 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        hashCode = 0xfc6f5b;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar7) goto LAB_00d1e2c1;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x18) <= (int)uVar12) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        hashCode = 0xfc6f78;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar7) goto LAB_00d1e2c1;
        *puVar9 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        hashCode = 0xfc6efb;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar7) goto LAB_00d1e2c1;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        hashCode = 0xfc6f19;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar7) goto LAB_00d1e2c1;
        *puVar9 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        hashCode = 0xfc6f3a;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar7) {
LAB_00d1e2c1:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
      uVar10 = (ulong)*(uint *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar8 = BaseDictionary<void_*,_Js::MapOrSetDataNode<void_*>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex
                          ((EntryType *)
                           ((long)(int)*(uint *)(this + 0x24) * 0x18 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar8;
      }
    }
    local_50 = (long)(int)uVar10;
    local_48 = local_50 * 0x18;
    this_00 = (DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               *)(*(long *)(this + 8) + local_48);
    pvVar2 = *key;
    local_40 = uVar10;
    Memory::Recycler::WBSetBit((char *)&local_60);
    local_60.ptr = pvVar2;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    pMVar3 = *value;
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58.ptr = pMVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    DefaultHashedEntry<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<Js::MapOrSetDataNode<void_*>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    ::Set(this_00,&local_60,&local_58,hashCode);
    lVar13 = *(long *)this;
    lVar4 = *(long *)(this + 8);
    *(undefined4 *)(lVar4 + 8 + local_48) = *(undefined4 *)(lVar13 + (ulong)local_34 * 4);
    *(int *)(lVar13 + (ulong)local_34 * 4) = (int)local_50;
    uVar11 = 0;
    iVar8 = (int)local_40;
    uVar10 = local_40;
    do {
      uVar12 = *(uint *)(lVar4 + 8 + (long)(int)uVar10 * 0x18);
      uVar10 = (ulong)uVar12;
      uVar11 = uVar11 + 1;
    } while (uVar12 != 0xffffffff);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar11);
    }
  }
  return iVar8;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }